

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

TokenType __thiscall QXmlStreamReader::readNext(QXmlStreamReader *this)

{
  _Head_base<0UL,_QXmlStreamReaderPrivate_*,_false> this_00;
  bool bVar1;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00._M_head_impl =
       (this->d_ptr)._M_t.
       super___uniq_ptr_impl<QXmlStreamReaderPrivate,_std::default_delete<QXmlStreamReaderPrivate>_>
       ._M_t.
       super__Tuple_impl<0UL,_QXmlStreamReaderPrivate_*,_std::default_delete<QXmlStreamReaderPrivate>_>
       .super__Head_base<0UL,_QXmlStreamReaderPrivate_*,_false>._M_head_impl;
  if ((this_00._M_head_impl)->type == Invalid) {
    if ((this_00._M_head_impl)->error == PrematureEndOfDocumentError) {
      (this_00._M_head_impl)->type = NoToken;
      (this_00._M_head_impl)->atEnd = false;
      (this_00._M_head_impl)->token = -1;
      goto LAB_003546f0;
    }
  }
  else {
LAB_003546f0:
    if (((this_00._M_head_impl)->field_0x3a8 & 0x10) == 0) {
      bVar1 = QXmlStreamReaderPrivate::checkStartDocument(this_00._M_head_impl);
      if (!bVar1) goto LAB_00354776;
    }
    QXmlStreamReaderPrivate::parse(this_00._M_head_impl);
    if ((this_00._M_head_impl)->atEnd == true) {
      if (((this_00._M_head_impl)->type | StartDocument) != EndDocument) {
        local_38.d = (Data *)0x0;
        local_38.ptr = (char16_t *)0x0;
        local_38.size = 0;
        QXmlStreamReaderPrivate::raiseError
                  (this_00._M_head_impl,PrematureEndOfDocumentError,(QString *)&local_38);
LAB_00354766:
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
      }
    }
    else if ((this_00._M_head_impl)->type == EndDocument) {
      QXmlStream::tr((QString *)&local_38,"Extra content at end of document.",(char *)0x0,-1);
      QXmlStreamReaderPrivate::raiseWellFormedError(this_00._M_head_impl,(QString *)&local_38);
      goto LAB_00354766;
    }
  }
  QXmlStreamReaderPrivate::checkToken(this_00._M_head_impl);
LAB_00354776:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (this_00._M_head_impl)->type;
  }
  __stack_chk_fail();
}

Assistant:

QXmlStreamReader::TokenType QXmlStreamReader::readNext()
{
    Q_D(QXmlStreamReader);
    if (d->type != Invalid) {
        if (!d->hasCheckedStartDocument)
            if (!d->checkStartDocument())
                return d->type; // synthetic StartDocument or error
        d->parse();
        if (d->atEnd && d->type != EndDocument && d->type != Invalid)
            d->raiseError(PrematureEndOfDocumentError);
        else if (!d->atEnd && d->type == EndDocument)
            d->raiseWellFormedError(QXmlStream::tr("Extra content at end of document."));
    } else if (d->error == PrematureEndOfDocumentError) {
        // resume error
        d->type = NoToken;
        d->atEnd = false;
        d->token = -1;
        return readNext();
    }
    d->checkToken();
    return d->type;
}